

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshCFaceListBlock(Parser *this,uint iNumFaces,Mesh *mesh)

{
  byte bVar1;
  char *pcVar2;
  pointer pFVar3;
  byte *pbVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint iIndex;
  uint aiValues [3];
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_44 = 0;
LAB_003fadfa:
  do {
    pcVar2 = this->filePtr;
    if (*pcVar2 == '*') {
      this->filePtr = pcVar2 + 1;
      iVar5 = strncmp("MESH_CFACE",pcVar2 + 1,10);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xb];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar9 = pcVar2 + 0xc;
          if (bVar1 == 0) {
            pcVar9 = pcVar2 + 0xb;
          }
          this->filePtr = pcVar9;
          local_40 = 0;
          ParseLV4MeshLongTriple(this,&local_3c,&local_40);
          uVar6 = (ulong)local_40;
          if ((local_40 < iNumFaces) &&
             (pFVar3 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                       super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                       _M_impl.super__Vector_impl_data._M_start,
             uVar8 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 2) *
                     0xf83e0f83e0f83e1, uVar6 <= uVar8 && uVar8 - uVar6 != 0)) {
            pFVar3[uVar6].mColorIndices[0] = local_3c;
            (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6].mColorIndices[1] = local_38;
            (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6].mColorIndices[2] = local_34;
          }
          else {
            LogWarning(this,"UV-Face has an invalid index. It will be ignored");
          }
          goto LAB_003fadfa;
        }
      }
    }
    pbVar4 = (byte *)this->filePtr;
    bVar1 = *pbVar4;
    uVar7 = (uint)bVar1;
    if (bVar1 == 0x7b) {
      local_44 = local_44 + 1;
    }
    else if (bVar1 == 0x7d) {
      local_44 = local_44 + -1;
      if (local_44 == 0) {
        this->filePtr = (char *)(pbVar4 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar7 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MESH_CFACE_LIST chunk (Level 3)");
    }
    if (((uVar7 < 0xe) && ((0x3401U >> (uVar7 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar4 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshCFaceListBlock(unsigned int iNumFaces, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_CFACE" ,10))
            {
                unsigned int aiValues[3];
                unsigned int iIndex = 0;

                ParseLV4MeshLongTriple(aiValues,iIndex);
                if (iIndex >= iNumFaces || iIndex >= mesh.mFaces.size())
                {
                    LogWarning("UV-Face has an invalid index. It will be ignored");
                }
                else
                {
                    // copy color indices
                    mesh.mFaces[iIndex].mColorIndices[0] = aiValues[0];
                    mesh.mFaces[iIndex].mColorIndices[1] = aiValues[1];
                    mesh.mFaces[iIndex].mColorIndices[2] = aiValues[2];
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_CFACE_LIST");
    }
    return;
}